

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_number_toExponential(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSValueUnion JVar2;
  ulong uVar3;
  int n_digits;
  int64_t iVar4;
  JSValueUnion JVar5;
  JSValue val;
  JSValue JVar6;
  JSValue JVar7;
  uint local_2c;
  double d;
  
  JVar6 = js_thisNumberValue(ctx,this_val);
  if ((int)JVar6.tag == 6) {
    JVar2.float64 = -NAN;
    JVar5 = JVar6.u;
  }
  else {
    iVar1 = JS_ToFloat64Free(ctx,&d,JVar6);
    iVar4 = 6;
    if ((iVar1 != 0) || (iVar1 = JS_ToInt32Sat(ctx,(int *)&local_2c,*argv), iVar1 != 0)) {
LAB_001576c0:
      JVar5.float64 = 0.0;
      uVar3 = 0;
      goto LAB_001576c2;
    }
    if ((ulong)ABS(d) < 0x7ff0000000000000) {
      if ((int)argv->tag == 3) {
        iVar1 = 4;
        n_digits = 0;
      }
      else {
        if (100 < local_2c) {
          JS_ThrowRangeError(ctx,"invalid number of digits");
          goto LAB_001576c0;
        }
        n_digits = local_2c + 1;
        iVar1 = 5;
      }
      JVar6 = js_dtoa(ctx,d,10,n_digits,iVar1);
    }
    else {
      val.tag = 7;
      val.u.float64 = d;
      JVar6 = JS_ToStringFree(ctx,val);
    }
    JVar2 = JVar6.u;
    JVar6.tag = JVar6.tag;
    JVar6.u.float64 = -NAN;
    JVar5 = JVar2;
  }
  iVar4 = JVar6.tag;
  uVar3 = (ulong)JVar6.u.ptr & (ulong)JVar2.ptr;
LAB_001576c2:
  JVar7.u.ptr = (void *)((ulong)JVar5.ptr & 0xffffffff | uVar3);
  JVar7.tag = iVar4;
  return JVar7;
}

Assistant:

static JSValue js_number_toExponential(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv)
{
    JSValue val;
    int f, flags;
    double d;

    val = js_thisNumberValue(ctx, this_val);
    if (JS_IsException(val))
        return val;
    if (JS_ToFloat64Free(ctx, &d, val))
        return JS_EXCEPTION;
    if (JS_ToInt32Sat(ctx, &f, argv[0]))
        return JS_EXCEPTION;
    if (!isfinite(d)) {
        return JS_ToStringFree(ctx,  __JS_NewFloat64(ctx, d));
    }
    if (JS_IsUndefined(argv[0])) {
        flags = 0;
        f = 0;
    } else {
        if (f < 0 || f > 100)
            return JS_ThrowRangeError(ctx, "invalid number of digits");
        f++;
        flags = JS_DTOA_FIXED_FORMAT;
    }
    return js_dtoa(ctx, d, 10, f, flags | JS_DTOA_FORCE_EXP);
}